

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectShadow.cpp
# Opt level: O0

SharedPtr<FontEffect> __thiscall
Rml::FontEffectShadowInstancer::InstanceFontEffect
          (FontEffectShadowInstancer *this,String *param_1,PropertyDictionary *properties)

{
  Vector2i _offset;
  bool bVar1;
  Property *pPVar2;
  element_type *peVar3;
  PropertyDictionary *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SharedPtr<FontEffect> SVar4;
  undefined1 local_48 [8];
  SharedPtr<Rml::FontEffectShadow> font_effect;
  int iStack_30;
  Colourb color;
  Vector2i offset;
  PropertyDictionary *properties_local;
  String *param_1_local;
  FontEffectShadowInstancer *this_local;
  
  Vector2<int>::Vector2((Vector2<int> *)&stack0xffffffffffffffd0);
  pPVar2 = PropertyDictionary::GetProperty(in_RCX,param_1[4].field_2._M_local_buf[0]);
  iStack_30 = Property::Get<int>(pPVar2);
  pPVar2 = PropertyDictionary::GetProperty(in_RCX,param_1[4].field_2._M_local_buf[1]);
  color = (Colourb)Property::Get<int>(pPVar2);
  pPVar2 = PropertyDictionary::GetProperty(in_RCX,param_1[4].field_2._M_local_buf[2]);
  font_effect.super___shared_ptr<Rml::FontEffectShadow,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._4_4_ = Property::Get<Rml::Colour<unsigned_char,255,false>>(pPVar2);
  MakeShared<Rml::FontEffectShadow>();
  peVar3 = ::std::
           __shared_ptr_access<Rml::FontEffectShadow,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Rml::FontEffectShadow,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_48);
  _offset.y._0_1_ = color.red;
  _offset.y._1_1_ = color.green;
  _offset.y._2_1_ = color.blue;
  _offset.y._3_1_ = color.alpha;
  _offset.x = iStack_30;
  bVar1 = FontEffectShadow::Initialise(peVar3,_offset);
  if (bVar1) {
    peVar3 = ::std::
             __shared_ptr_access<Rml::FontEffectShadow,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Rml::FontEffectShadow,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_48);
    FontEffect::SetColour
              (&peVar3->super_FontEffect,
               font_effect.super___shared_ptr<Rml::FontEffectShadow,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_);
    ::std::shared_ptr<Rml::FontEffect>::shared_ptr<Rml::FontEffectShadow,void>
              ((shared_ptr<Rml::FontEffect> *)this,(shared_ptr<Rml::FontEffectShadow> *)local_48);
  }
  else {
    ::std::shared_ptr<Rml::FontEffect>::shared_ptr
              ((shared_ptr<Rml::FontEffect> *)this,(nullptr_t)0x0);
  }
  ::std::shared_ptr<Rml::FontEffectShadow>::~shared_ptr
            ((shared_ptr<Rml::FontEffectShadow> *)local_48);
  SVar4.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar4.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SharedPtr<FontEffect>)
         SVar4.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<FontEffect> FontEffectShadowInstancer::InstanceFontEffect(const String& /*name*/, const PropertyDictionary& properties)
{
	Vector2i offset;
	offset.x = properties.GetProperty(id_offset_x)->Get<int>();
	offset.y = properties.GetProperty(id_offset_y)->Get<int>();
	Colourb color = properties.GetProperty(id_color)->Get<Colourb>();

	auto font_effect = MakeShared<FontEffectShadow>();
	if (font_effect->Initialise(offset))
	{
		font_effect->SetColour(color);
		return font_effect;
	}

	return nullptr;
}